

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cc
# Opt level: O0

vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_> *
benchmark::ComputeStats
          (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           *reports)

{
  ulong uVar1;
  bool bVar2;
  __type_conflict _Var3;
  size_type sVar4;
  const_reference pvVar5;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *in_RSI;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *in_RDI;
  Stat1<double,_long> *this;
  value_type *__x;
  Run *this_00;
  Run stddev_data;
  size_t i;
  Run mean_data;
  Run *run;
  const_iterator __end1;
  const_iterator __begin1;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *__range1;
  int64_t run_iterations;
  Stat1_d items_per_second_stat;
  Stat1_d bytes_per_second_stat;
  Stat1_d cpu_accumulated_time_stat;
  Stat1_d real_accumulated_time_stat;
  difference_type error_count;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc68;
  Run *in_stack_fffffffffffffc70;
  double *in_stack_fffffffffffffc78;
  Stat1<double,_long> *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [72];
  undefined8 local_290;
  Stat1<double,_long> *local_280;
  Stat1<double,_long> *local_278;
  value_type *local_270;
  Run *local_268;
  ulong local_240;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [72];
  int64_t local_1b0;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  Self local_160;
  Self local_148;
  double local_130;
  Self local_128;
  double local_110;
  Self local_108;
  byte local_e9;
  CheckHandler local_e8;
  byte local_d9;
  CheckHandler local_d8;
  reference local_d0;
  Run *local_c8;
  __normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
  local_c0;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *local_b8;
  int64_t local_b0;
  Stat1<double,_long> local_a8;
  Stat1<double,_long> local_90;
  Stat1<double,_long> local_78;
  Stat1<double,_long> local_60;
  undefined4 local_48;
  Run *local_30;
  Run *local_28;
  long local_20;
  byte local_11;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  ::vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            *)0x1803b1);
  local_28 = (Run *)std::
                    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    ::begin((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                             *)in_stack_fffffffffffffc68);
  local_30 = (Run *)std::
                    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    ::end((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                           *)in_stack_fffffffffffffc68);
  local_20 = std::
             count_if<__gnu_cxx::__normal_iterator<benchmark::BenchmarkReporter::Run_const*,std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>>,benchmark::ComputeStats(std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>const&)::__0>
                       (local_28,local_30);
  sVar4 = std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::size(local_10);
  if (sVar4 - local_20 < 2) {
    local_11 = 1;
    local_48 = 1;
  }
  else {
    Stat1<double,_long>::Stat1((Stat1<double,_long> *)0x18045d);
    Stat1<double,_long>::Stat1((Stat1<double,_long> *)0x18046c);
    Stat1<double,_long>::Stat1((Stat1<double,_long> *)0x18047b);
    Stat1<double,_long>::Stat1((Stat1<double,_long> *)0x18048a);
    pvVar5 = std::
             vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             ::front((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                      *)in_stack_fffffffffffffc70);
    local_b0 = pvVar5->iterations;
    local_b8 = local_10;
    local_c0._M_current =
         (Run *)std::
                vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                ::begin((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                         *)in_stack_fffffffffffffc68);
    local_c8 = (Run *)std::
                      vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                      ::end((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                             *)in_stack_fffffffffffffc68);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                               *)in_stack_fffffffffffffc70,
                              (__normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                               *)in_stack_fffffffffffffc68), bVar2) {
      local_d0 = __gnu_cxx::
                 __normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                 ::operator*(&local_c0);
      std::
      vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ::operator[](local_10,0);
      _Var3 = std::operator==(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      local_d9 = 0;
      if (_Var3) {
        internal::GetNullLogInstance();
      }
      else {
        internal::CheckHandler::CheckHandler
                  ((CheckHandler *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                   (char *)in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                   (int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
        local_d9 = 1;
        internal::CheckHandler::GetLog(&local_d8);
      }
      if ((local_d9 & 1) != 0) {
        internal::CheckHandler::~CheckHandler((CheckHandler *)&UNK_001805a6);
      }
      local_e9 = 0;
      if (local_b0 == local_d0->iterations) {
        internal::GetNullLogInstance();
      }
      else {
        internal::CheckHandler::CheckHandler
                  ((CheckHandler *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                   (char *)in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                   (int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
        local_e9 = 1;
        internal::CheckHandler::GetLog(&local_e8);
      }
      if ((local_e9 & 1) != 0) {
        internal::CheckHandler::~CheckHandler((CheckHandler *)&UNK_00180655);
      }
      if ((local_d0->error_occurred & 1U) == 0) {
        local_110 = local_d0->real_accumulated_time / (double)local_d0->iterations;
        Stat1<double,_long>::Stat1
                  (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   (long *)in_stack_fffffffffffffc70);
        Stat1<double,_long>::operator+=(&local_60,&local_108);
        local_130 = local_d0->cpu_accumulated_time / (double)local_d0->iterations;
        Stat1<double,_long>::Stat1
                  (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   (long *)in_stack_fffffffffffffc70);
        Stat1<double,_long>::operator+=(&local_78,&local_128);
        Stat1<double,_long>::Stat1
                  (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   (long *)in_stack_fffffffffffffc70);
        Stat1<double,_long>::operator+=(&local_a8,&local_148);
        Stat1<double,_long>::Stat1
                  (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   (long *)in_stack_fffffffffffffc70);
        Stat1<double,_long>::operator+=(&local_90,&local_160);
      }
      __gnu_cxx::
      __normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
      ::operator++(&local_c0);
    }
    BenchmarkReporter::Run::Run(in_stack_fffffffffffffc70);
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    operator[](local_10,0);
    std::operator+(in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90);
    std::__cxx11::string::operator=(local_218,local_238);
    std::__cxx11::string::~string(local_238);
    local_1b0 = local_b0;
    local_1a0 = Stat1<double,_long>::Mean(&local_60);
    local_1a0 = local_1a0 * (double)local_b0;
    local_198 = Stat1<double,_long>::Mean(&local_78);
    local_198 = local_198 * (double)local_b0;
    local_190 = Stat1<double,_long>::Mean(&local_90);
    local_188 = Stat1<double,_long>::Mean(&local_a8);
    pvVar5 = std::
             vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             ::operator[](local_10,0);
    std::__cxx11::string::operator=(local_1f8,(string *)&pvVar5->report_label);
    for (local_240 = 1; uVar1 = local_240,
        sVar4 = std::
                vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                ::size(local_10), uVar1 < sVar4; local_240 = local_240 + 1) {
      pvVar5 = std::
               vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
               ::operator[](local_10,local_240);
      in_stack_fffffffffffffc98 = &pvVar5->report_label;
      std::
      vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ::operator[](local_10,0);
      bVar2 = std::operator!=(&in_stack_fffffffffffffc70->benchmark_name,in_stack_fffffffffffffc68);
      if (bVar2) {
        std::__cxx11::string::operator=(local_1f8,"");
        break;
      }
    }
    BenchmarkReporter::Run::Run(in_stack_fffffffffffffc70);
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    operator[](local_10,0);
    std::operator+(in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90);
    this_01 = local_318;
    std::__cxx11::string::operator=(local_2f8,this_01);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::operator=(local_2d8,local_1f8);
    local_290 = 0;
    this = (Stat1<double,_long> *)
           Stat1<double,_long>::StdDev((Stat1<double,_long> *)in_stack_fffffffffffffc88);
    local_280 = this;
    in_stack_fffffffffffffc80 = (Stat1<double,_long> *)Stat1<double,_long>::StdDev(this);
    local_278 = in_stack_fffffffffffffc80;
    __x = (value_type *)Stat1<double,_long>::StdDev(this);
    local_270 = __x;
    this_00 = (Run *)Stat1<double,_long>::StdDev(this);
    local_268 = this_00;
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    push_back((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
               *)in_stack_fffffffffffffc80,__x);
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    push_back((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
               *)in_stack_fffffffffffffc80,__x);
    local_11 = 1;
    local_48 = 1;
    BenchmarkReporter::Run::~Run(this_00);
    BenchmarkReporter::Run::~Run(this_00);
  }
  if ((local_11 & 1) == 0) {
    std::
    vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>::
    ~vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             *)in_stack_fffffffffffffc80);
  }
  return in_RDI;
}

Assistant:

std::vector<BenchmarkReporter::Run> ComputeStats(
    const std::vector<BenchmarkReporter::Run>& reports) {
  typedef BenchmarkReporter::Run Run;
  std::vector<Run> results;

  auto error_count =
      std::count_if(reports.begin(), reports.end(),
                    [](Run const& run) { return run.error_occurred; });

  if (reports.size() - error_count < 2) {
    // We don't report aggregated data if there was a single run.
    return results;
  }
  // Accumulators.
  Stat1_d real_accumulated_time_stat;
  Stat1_d cpu_accumulated_time_stat;
  Stat1_d bytes_per_second_stat;
  Stat1_d items_per_second_stat;
  // All repetitions should be run with the same number of iterations so we
  // can take this information from the first benchmark.
  int64_t const run_iterations = reports.front().iterations;

  // Populate the accumulators.
  for (Run const& run : reports) {
    CHECK_EQ(reports[0].benchmark_name, run.benchmark_name);
    CHECK_EQ(run_iterations, run.iterations);
    if (run.error_occurred) continue;
    real_accumulated_time_stat +=
        Stat1_d(run.real_accumulated_time / run.iterations, run.iterations);
    cpu_accumulated_time_stat +=
        Stat1_d(run.cpu_accumulated_time / run.iterations, run.iterations);
    items_per_second_stat += Stat1_d(run.items_per_second, run.iterations);
    bytes_per_second_stat += Stat1_d(run.bytes_per_second, run.iterations);
  }

  // Get the data from the accumulator to BenchmarkReporter::Run's.
  Run mean_data;
  mean_data.benchmark_name = reports[0].benchmark_name + "_mean";
  mean_data.iterations = run_iterations;
  mean_data.real_accumulated_time =
      real_accumulated_time_stat.Mean() * run_iterations;
  mean_data.cpu_accumulated_time =
      cpu_accumulated_time_stat.Mean() * run_iterations;
  mean_data.bytes_per_second = bytes_per_second_stat.Mean();
  mean_data.items_per_second = items_per_second_stat.Mean();

  // Only add label to mean/stddev if it is same for all runs
  mean_data.report_label = reports[0].report_label;
  for (std::size_t i = 1; i < reports.size(); i++) {
    if (reports[i].report_label != reports[0].report_label) {
      mean_data.report_label = "";
      break;
    }
  }

  Run stddev_data;
  stddev_data.benchmark_name = reports[0].benchmark_name + "_stddev";
  stddev_data.report_label = mean_data.report_label;
  stddev_data.iterations = 0;
  stddev_data.real_accumulated_time = real_accumulated_time_stat.StdDev();
  stddev_data.cpu_accumulated_time = cpu_accumulated_time_stat.StdDev();
  stddev_data.bytes_per_second = bytes_per_second_stat.StdDev();
  stddev_data.items_per_second = items_per_second_stat.StdDev();

  results.push_back(mean_data);
  results.push_back(stddev_data);
  return results;
}